

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  uint uVar2;
  float *pfVar3;
  uchar *__ptr;
  uint uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  float *pfVar9;
  float *pfVar10;
  ulong uVar11;
  float *pfVar12;
  uchar *puVar13;
  long lVar14;
  float fVar15;
  
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    __ptr = stbi__load_flip(s,x,y,comp,req_comp);
    if (__ptr == (uchar *)0x0) {
      stbi__g_failure_reason = "unknown image type";
    }
    else {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      uVar7 = *y * *x;
      pfVar3 = (float *)malloc((long)(int)(req_comp * uVar7) << 2);
      if (pfVar3 != (float *)0x0) {
        if (0 < (int)uVar7) {
          uVar4 = (req_comp + (req_comp & 1U)) - 1;
          lVar5 = (long)req_comp;
          uVar8 = 0;
          pfVar9 = pfVar3;
          puVar13 = __ptr;
          do {
            uVar2 = 0;
            if (0 < (int)uVar4) {
              uVar11 = 0;
              do {
                fVar15 = powf((float)puVar13[uVar11] / 255.0,stbi__l2h_gamma);
                pfVar9[uVar11] = fVar15 * stbi__l2h_scale;
                uVar11 = uVar11 + 1;
                uVar2 = uVar4;
              } while (uVar4 != uVar11);
            }
            if ((int)uVar2 < req_comp) {
              lVar14 = (ulong)uVar2 + uVar8 * lVar5;
              pfVar3[lVar14] = (float)__ptr[lVar14] / 255.0;
            }
            uVar8 = uVar8 + 1;
            pfVar9 = pfVar9 + lVar5;
            puVar13 = puVar13 + lVar5;
          } while (uVar8 != uVar7);
        }
        free(__ptr);
        return pfVar3;
      }
      free(__ptr);
      stbi__g_failure_reason = "outofmem";
    }
  }
  else {
    pfVar3 = stbi__hdr_load(s,x,y,comp,req_comp);
    if (pfVar3 != (float *)0x0) {
      if (stbi__vertically_flip_on_load == 0) {
        return pfVar3;
      }
      if (req_comp == 0) {
        req_comp = *comp;
      }
      uVar7 = *y >> 1;
      if ((int)uVar7 < 1) {
        return pfVar3;
      }
      iVar1 = *x;
      lVar5 = (long)req_comp;
      iVar6 = (*y + -1) * iVar1;
      uVar8 = 0;
      pfVar9 = pfVar3;
      do {
        if (0 < iVar1) {
          pfVar10 = (float *)((long)iVar6 * lVar5 * 4 + (long)pfVar3);
          lVar14 = 0;
          pfVar12 = pfVar9;
          do {
            if (0 < req_comp) {
              uVar11 = 0;
              do {
                fVar15 = pfVar12[uVar11];
                pfVar12[uVar11] = pfVar10[uVar11];
                pfVar10[uVar11] = fVar15;
                uVar11 = uVar11 + 1;
              } while ((uint)req_comp != uVar11);
            }
            lVar14 = lVar14 + 1;
            pfVar10 = pfVar10 + lVar5;
            pfVar12 = pfVar12 + lVar5;
          } while (lVar14 != iVar1);
        }
        uVar8 = uVar8 + 1;
        iVar6 = iVar6 - iVar1;
        pfVar9 = pfVar9 + lVar5 * iVar1;
      } while (uVar8 != uVar7);
      return pfVar3;
    }
  }
  return (float *)0x0;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_flip(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}